

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decimal128.c
# Opt level: O3

void test_decimal128_to_string__regular(void)

{
  int iVar1;
  char *pcVar2;
  ulong unaff_R14;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  char bid_string [43];
  bson_decimal128_t full_house;
  bson_decimal128_t all_digits;
  bson_decimal128_t trailing_zeros;
  bson_decimal128_t largest_regular;
  bson_decimal128_t smallest_regular;
  bson_decimal128_t tenth;
  bson_decimal128_t negative_zero;
  bson_decimal128_t negative_one;
  bson_decimal128_t two;
  bson_decimal128_t zero;
  bson_decimal128_t one;
  char cStack_538;
  char cStack_537;
  char cStack_536;
  char cStack_535;
  char cStack_534;
  char cStack_533;
  char cStack_532;
  char cStack_531;
  char cStack_530;
  char cStack_52f;
  char cStack_52e;
  char cStack_52d;
  char cStack_52c;
  char cStack_52b;
  char cStack_52a;
  char cStack_529;
  char cStack_528;
  char cStack_527;
  char cStack_526;
  char cStack_525;
  char cStack_524;
  char cStack_523;
  char cStack_522;
  char cStack_521;
  char cStack_520;
  char cStack_51f;
  char cStack_51e;
  char cStack_51d;
  char cStack_51c;
  char cStack_51b;
  char cStack_51a;
  char cStack_519;
  char cStack_518;
  char cStack_517;
  char cStack_516;
  char cStack_515;
  char cStack_514;
  char cStack_513;
  char cStack_512;
  char cStack_511;
  char cStack_510;
  char cStack_50f;
  char cStack_50e;
  char cStack_50d;
  char cStack_50c;
  char cStack_50b;
  char cStack_50a;
  char cStack_509;
  char cStack_508;
  char cStack_507;
  char cStack_506;
  char cStack_505;
  char cStack_504;
  char cStack_503;
  char cStack_502;
  char cStack_501;
  char cStack_500;
  char cStack_4ff;
  char cStack_4fe;
  char cStack_4fd;
  char cStack_4fc;
  char cStack_4fb;
  char cStack_4fa;
  char cStack_4f9;
  code *pcStack_4f8;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  char cStack_4d8;
  char cStack_4d7;
  char cStack_4d6;
  char cStack_4d5;
  char cStack_4d4;
  char cStack_4d3;
  char cStack_4d2;
  char cStack_4d1;
  char cStack_4d0;
  char cStack_4cf;
  char cStack_4ce;
  char cStack_4cd;
  char cStack_4cc;
  char cStack_4cb;
  char cStack_4ca;
  char cStack_4c9;
  char cStack_4c8;
  char cStack_4c7;
  char cStack_4c6;
  char cStack_4c5;
  char cStack_4c4;
  char cStack_4c3;
  char cStack_4c2;
  char cStack_4c1;
  char cStack_4c0;
  char cStack_4bf;
  char cStack_4be;
  char cStack_4bd;
  char cStack_4bc;
  char cStack_4bb;
  char cStack_4ba;
  char cStack_4b9;
  char cStack_4b8;
  char cStack_4b7;
  char cStack_4b6;
  char cStack_4b5;
  char cStack_4b4;
  char cStack_4b3;
  char cStack_4b2;
  char cStack_4b1;
  char cStack_4b0;
  char cStack_4af;
  char cStack_4ae;
  char cStack_4ad;
  char cStack_4ac;
  char cStack_4ab;
  char cStack_4aa;
  char cStack_4a9;
  char cStack_4a8;
  char cStack_4a7;
  char cStack_4a6;
  char cStack_4a5;
  char cStack_4a4;
  char cStack_4a3;
  char cStack_4a2;
  char cStack_4a1;
  char cStack_4a0;
  char cStack_49f;
  char cStack_49e;
  char cStack_49d;
  char cStack_49c;
  char cStack_49b;
  char cStack_49a;
  char cStack_499;
  char *pcStack_498;
  code *pcStack_490;
  undefined8 uStack_488;
  undefined8 uStack_480;
  char cStack_478;
  char cStack_477;
  char cStack_476;
  char cStack_475;
  char cStack_474;
  char cStack_473;
  char cStack_472;
  char cStack_471;
  char cStack_470;
  char cStack_46f;
  char cStack_46e;
  char cStack_46d;
  char cStack_46c;
  char cStack_46b;
  char cStack_46a;
  char cStack_469;
  char cStack_468;
  char cStack_467;
  char cStack_466;
  char cStack_465;
  char cStack_464;
  char cStack_463;
  char cStack_462;
  char cStack_461;
  char cStack_460;
  char cStack_45f;
  char cStack_45e;
  char cStack_45d;
  char cStack_45c;
  char cStack_45b;
  char cStack_45a;
  char cStack_459;
  char cStack_458;
  char cStack_457;
  char cStack_456;
  char cStack_455;
  char cStack_454;
  char cStack_453;
  char cStack_452;
  char cStack_451;
  char cStack_450;
  char cStack_44f;
  char cStack_44e;
  char cStack_44d;
  char cStack_44c;
  char cStack_44b;
  char cStack_44a;
  char cStack_449;
  char cStack_448;
  char cStack_447;
  char cStack_446;
  char cStack_445;
  char cStack_444;
  char cStack_443;
  char cStack_442;
  char cStack_441;
  char cStack_440;
  char cStack_43f;
  char cStack_43e;
  char cStack_43d;
  char cStack_43c;
  char cStack_43b;
  char cStack_43a;
  char cStack_439;
  char cStack_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  code *pcStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  char cStack_410;
  char cStack_40f;
  char cStack_40e;
  char cStack_40d;
  char cStack_40c;
  char cStack_40b;
  char cStack_40a;
  char cStack_409;
  char cStack_408;
  char cStack_407;
  char cStack_406;
  char cStack_405;
  char cStack_404;
  char cStack_403;
  char cStack_402;
  char cStack_401;
  undefined1 auStack_400 [16];
  undefined1 auStack_3f0 [16];
  char cStack_3e0;
  char cStack_3df;
  char cStack_3de;
  char cStack_3dd;
  char cStack_3dc;
  char cStack_3db;
  char cStack_3da;
  char cStack_3d9;
  char cStack_3d8;
  char cStack_3d7;
  char cStack_3d6;
  char cStack_3d5;
  char cStack_3d4;
  char cStack_3d3;
  char cStack_3d2;
  char cStack_3d1;
  char cStack_3d0;
  char cStack_3cf;
  char cStack_3ce;
  char cStack_3cd;
  char cStack_3cc;
  char cStack_3cb;
  char cStack_3ca;
  char cStack_3c9;
  char cStack_3c8;
  char cStack_3c7;
  char cStack_3c6;
  char cStack_3c5;
  char cStack_3c4;
  char cStack_3c3;
  char cStack_3c2;
  char cStack_3c1;
  char cStack_3c0;
  char cStack_3bf;
  char cStack_3be;
  char cStack_3bd;
  char cStack_3bc;
  char cStack_3bb;
  char cStack_3ba;
  char cStack_3b9;
  char cStack_3b8;
  char cStack_3b7;
  char cStack_3b6;
  char cStack_3b5;
  char cStack_3b4;
  char cStack_3b3;
  char cStack_3b2;
  char cStack_3b1;
  char cStack_3b0;
  char cStack_3af;
  char cStack_3ae;
  char cStack_3ad;
  char cStack_3ac;
  char cStack_3ab;
  char cStack_3aa;
  char cStack_3a9;
  char cStack_3a8;
  char cStack_3a7;
  char cStack_3a6;
  char cStack_3a5;
  char cStack_3a4;
  char cStack_3a3;
  char cStack_3a2;
  char cStack_3a1;
  code *pcStack_3a0;
  undefined8 uStack_390;
  undefined8 uStack_388;
  char cStack_380;
  char cStack_37f;
  char cStack_37e;
  char cStack_37d;
  char cStack_37c;
  char cStack_37b;
  char cStack_37a;
  char cStack_379;
  char cStack_378;
  char cStack_377;
  char cStack_376;
  char cStack_375;
  char cStack_374;
  char cStack_373;
  char cStack_372;
  char cStack_371;
  char cStack_370;
  char cStack_36f;
  char cStack_36e;
  char cStack_36d;
  char cStack_36c;
  char cStack_36b;
  char cStack_36a;
  char cStack_369;
  char cStack_368;
  char cStack_367;
  char cStack_366;
  char cStack_365;
  char cStack_364;
  char cStack_363;
  char cStack_362;
  char cStack_361;
  char cStack_360;
  char cStack_35f;
  char cStack_35e;
  char cStack_35d;
  char cStack_35c;
  char cStack_35b;
  char cStack_35a;
  char cStack_359;
  char cStack_358;
  char cStack_357;
  char cStack_356;
  char cStack_355;
  char cStack_354;
  char cStack_353;
  char cStack_352;
  char cStack_351;
  char cStack_350;
  char cStack_34f;
  char cStack_34e;
  char cStack_34d;
  char cStack_34c;
  char cStack_34b;
  char cStack_34a;
  char cStack_349;
  char cStack_348;
  char cStack_347;
  char cStack_346;
  char cStack_345;
  char cStack_344;
  char cStack_343;
  char cStack_342;
  char cStack_341;
  char cStack_340;
  char cStack_33f;
  char cStack_33e;
  char cStack_33d;
  char cStack_33c;
  char cStack_33b;
  char cStack_33a;
  char cStack_339;
  char cStack_338;
  char cStack_337;
  char cStack_336;
  char cStack_335;
  char cStack_334;
  char cStack_333;
  char cStack_332;
  char cStack_331;
  char cStack_330;
  char cStack_32f;
  char cStack_32e;
  char cStack_32d;
  char cStack_32c;
  char cStack_32b;
  char cStack_32a;
  char cStack_329;
  char cStack_328;
  char cStack_327;
  char cStack_326;
  char cStack_325;
  char cStack_324;
  char cStack_323;
  char cStack_322;
  char cStack_321;
  char cStack_320;
  char cStack_31f;
  char cStack_31e;
  char cStack_31d;
  char cStack_31c;
  char cStack_31b;
  char cStack_31a;
  char cStack_319;
  char cStack_318;
  char cStack_317;
  char cStack_316;
  char cStack_315;
  char cStack_314;
  char cStack_313;
  char cStack_312;
  char cStack_311;
  char cStack_310;
  char cStack_30f;
  char cStack_30e;
  char cStack_30d;
  char cStack_30c;
  char cStack_30b;
  char cStack_30a;
  char cStack_309;
  char cStack_308;
  char cStack_307;
  char cStack_306;
  char cStack_305;
  char cStack_304;
  char cStack_303;
  char cStack_302;
  char cStack_301;
  char cStack_300;
  char cStack_2ff;
  char cStack_2fe;
  char cStack_2fd;
  char cStack_2fc;
  char cStack_2fb;
  char cStack_2fa;
  char cStack_2f9;
  char cStack_2f8;
  char cStack_2f7;
  char cStack_2f6;
  char cStack_2f5;
  char cStack_2f4;
  char cStack_2f3;
  char cStack_2f2;
  char cStack_2f1;
  char cStack_2f0;
  char cStack_2ef;
  char cStack_2ee;
  char cStack_2ed;
  char cStack_2ec;
  char cStack_2eb;
  char cStack_2ea;
  char cStack_2e9;
  char cStack_2e8;
  char cStack_2e7;
  char cStack_2e6;
  char cStack_2e5;
  char cStack_2e4;
  char cStack_2e3;
  char cStack_2e2;
  char cStack_2e1;
  undefined1 *puStack_2e0;
  code *pcStack_2d8;
  undefined1 auStack_2c8 [8];
  long lStack_2c0;
  undefined1 *puStack_2b8;
  code *pcStack_2b0;
  undefined1 auStack_2a0 [8];
  long lStack_298;
  undefined1 *puStack_290;
  code *pcStack_288;
  undefined1 auStack_278 [8];
  long lStack_270;
  short *psStack_268;
  code *pcStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_240;
  short sStack_238;
  undefined1 uStack_236;
  int iStack_235;
  undefined8 uStack_208;
  undefined8 uStack_200;
  code *pcStack_1f8;
  char cStack_1f0;
  char cStack_1ef;
  char cStack_1ee;
  char cStack_1ed;
  char cStack_1ec;
  char cStack_1eb;
  char cStack_1ea;
  char cStack_1e9;
  char cStack_1e8;
  char cStack_1e7;
  char cStack_1e6;
  char cStack_1e5;
  char cStack_1e4;
  char cStack_1e3;
  char cStack_1e2;
  char cStack_1e1;
  undefined4 uStack_1e0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined1 *puStack_108;
  code *pcStack_100;
  short local_f8;
  char cStack_f6;
  undefined1 uStack_f5;
  undefined1 uStack_f4;
  undefined1 uStack_f3;
  undefined2 uStack_f2;
  char local_f0;
  undefined4 uStack_ef;
  undefined1 uStack_eb;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = 0x3040000000000000;
  local_20 = 1;
  local_28 = 0x3040000000000000;
  local_30 = 0;
  local_38 = 0x3040000000000000;
  local_40 = 2;
  local_48 = 0xb040000000000000;
  local_50 = 1;
  local_58 = 0xb040000000000000;
  local_60 = 0;
  local_68 = 0x303e000000000000;
  local_70 = 1;
  local_78 = 0x3034000000000000;
  local_80 = 0x4d2;
  local_88 = 0x3040000000000000;
  local_90 = 0x1cbe991a14;
  local_98 = 0x302a000000000000;
  local_a0 = 0x75aef40;
  local_a8 = 0x2ffc3cde6fff9732;
  local_b0 = 0xde825cd07e96aff2;
  local_b8 = 0x3040ffffffffffff;
  local_c0 = 0xffffffffffffffff;
  pcStack_100 = (code *)0x127c19;
  bson_decimal128_to_string(&local_20,&local_f8);
  if (local_f8 == 0x31) {
    pcStack_100 = (code *)0x127c36;
    bson_decimal128_to_string(&local_30,&local_f8);
    if (local_f8 != 0x30) goto LAB_00127db5;
    pcStack_100 = (code *)0x127c53;
    bson_decimal128_to_string(&local_40,&local_f8);
    if (local_f8 != 0x32) goto LAB_00127dba;
    pcStack_100 = (code *)0x127c70;
    bson_decimal128_to_string(&local_50,&local_f8);
    if (cStack_f6 != '\0' || local_f8 != 0x312d) goto LAB_00127dbf;
    pcStack_100 = (code *)0x127c97;
    bson_decimal128_to_string(&local_60,&local_f8);
    if (cStack_f6 != '\0' || local_f8 != 0x302d) goto LAB_00127dc4;
    pcStack_100 = (code *)0x127cbe;
    bson_decimal128_to_string(&local_70,&local_f8);
    if (CONCAT13(uStack_f5,CONCAT12(cStack_f6,local_f8)) != 0x312e30) goto LAB_00127dc9;
    unaff_R14 = 0x3433323130302e30;
    pcStack_100 = (code *)0x127ce4;
    bson_decimal128_to_string(&local_80,&local_f8);
    if (local_f0 != '\0' ||
        CONCAT26(uStack_f2,
                 CONCAT15(uStack_f3,
                          CONCAT14(uStack_f4,CONCAT13(uStack_f5,CONCAT12(cStack_f6,local_f8))))) !=
        0x3433323130302e30) goto LAB_00127dce;
    pcStack_100 = (code *)0x127d07;
    bson_decimal128_to_string(&local_90,&local_f8);
    if (CONCAT44(uStack_ef,CONCAT13(local_f0,CONCAT21(uStack_f2,uStack_f3))) != 0x32313039383736 ||
        CONCAT26(uStack_f2,
                 CONCAT15(uStack_f3,
                          CONCAT14(uStack_f4,CONCAT13(uStack_f5,CONCAT12(cStack_f6,local_f8))))) !=
        0x3837363534333231) goto LAB_00127dd3;
    pcStack_100 = (code *)0x127d3b;
    bson_decimal128_to_string(&local_a0,&local_f8);
    unaff_R14 = CONCAT26(uStack_f2,
                         CONCAT15(uStack_f3,
                                  CONCAT14(uStack_f4,
                                           CONCAT13(uStack_f5,CONCAT12(cStack_f6,local_f8))))) ^
                0x3433323130302e30;
    if (CONCAT17(uStack_eb,CONCAT43(uStack_ef,CONCAT12(local_f0,uStack_f2))) != 0x30303030303433 ||
        unaff_R14 != 0) goto LAB_00127dd8;
    pcStack_100 = (code *)0x127d65;
    bson_decimal128_to_string(&local_b0,&local_f8);
    pcStack_100 = (code *)0x127d79;
    iVar1 = bcmp("0.1234567890123456789012345678901234",&local_f8,0x25);
    if (iVar1 != 0) goto LAB_00127ddd;
    pcStack_100 = (code *)0x127d8d;
    bson_decimal128_to_string(&local_c0,&local_f8);
    pcStack_100 = (code *)0x127da1;
    iVar1 = bcmp("5192296858534827628530496329220095",&local_f8,0x23);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    pcStack_100 = (code *)0x127db5;
    test_decimal128_to_string__regular_cold_1();
LAB_00127db5:
    pcStack_100 = (code *)0x127dba;
    test_decimal128_to_string__regular_cold_2();
LAB_00127dba:
    pcStack_100 = (code *)0x127dbf;
    test_decimal128_to_string__regular_cold_3();
LAB_00127dbf:
    pcStack_100 = (code *)0x127dc4;
    test_decimal128_to_string__regular_cold_4();
LAB_00127dc4:
    pcStack_100 = (code *)0x127dc9;
    test_decimal128_to_string__regular_cold_5();
LAB_00127dc9:
    pcStack_100 = (code *)0x127dce;
    test_decimal128_to_string__regular_cold_6();
LAB_00127dce:
    pcStack_100 = (code *)0x127dd3;
    test_decimal128_to_string__regular_cold_7();
LAB_00127dd3:
    pcStack_100 = (code *)0x127dd8;
    test_decimal128_to_string__regular_cold_8();
LAB_00127dd8:
    pcStack_100 = (code *)0x127ddd;
    test_decimal128_to_string__regular_cold_9();
LAB_00127ddd:
    pcStack_100 = (code *)0x127de2;
    test_decimal128_to_string__regular_cold_10();
  }
  pcStack_100 = test_decimal128_to_string__scientific;
  test_decimal128_to_string__regular_cold_11();
  uStack_110 = 0x5ffe314dc6448d93;
  uStack_118 = 0x38c15b0a00000000;
  uStack_120 = 0;
  uStack_128 = 1;
  uStack_1b0 = 0x8000000000000000;
  uStack_1b8 = 1;
  uStack_130 = 0x3108000000000000;
  uStack_138 = 0x9184db63eb1;
  uStack_140 = 0x5fffed09bead87c0;
  uStack_148 = 0x378d8e63ffffffff;
  uStack_150 = 0x1ed09bead87c0;
  uStack_158 = 0x378d8e63ffffffff;
  uStack_160 = 0x304c000000000000;
  uStack_168 = 0x41a;
  uStack_170 = 0x3042000000000000;
  uStack_178 = 0x41a;
  uStack_180 = 0x3040000000000000;
  uStack_188 = 0x69;
  uStack_190 = 0x3042000000000000;
  uStack_198 = 0x69;
  uStack_1a0 = 0x3046000000000000;
  uStack_1a8 = 1;
  pcStack_1f8 = (code *)0x127f1b;
  puStack_108 = (undefined1 *)&local_f8;
  pcStack_100 = (code *)unaff_R14;
  bson_decimal128_to_string(&uStack_118,&cStack_1f0);
  pcStack_1f8 = (code *)0x127f2f;
  iVar1 = bcmp("1.000000000000000000000000000000000E+6144",&cStack_1f0,0x2a);
  if (iVar1 == 0) {
    pcStack_1f8 = (code *)0x127f4a;
    bson_decimal128_to_string(&uStack_128,&cStack_1f0);
    if (CONCAT17(cStack_1e9,
                 CONCAT16(cStack_1ea,
                          CONCAT15(cStack_1eb,
                                   CONCAT14(cStack_1ec,
                                            CONCAT13(cStack_1ed,
                                                     CONCAT12(cStack_1ee,
                                                              CONCAT11(cStack_1ef,cStack_1f0)))))))
        != 0x363731362d4531) goto LAB_00128104;
    unaff_R14 = 0x363731362d45312d;
    pcStack_1f8 = (code *)0x127f77;
    bson_decimal128_to_string(&uStack_1b8,&cStack_1f0);
    if (cStack_1e8 != '\0' ||
        CONCAT17(cStack_1e9,
                 CONCAT16(cStack_1ea,
                          CONCAT15(cStack_1eb,
                                   CONCAT14(cStack_1ec,
                                            CONCAT13(cStack_1ed,
                                                     CONCAT12(cStack_1ee,
                                                              CONCAT11(cStack_1ef,cStack_1f0)))))))
        != 0x363731362d45312d) goto LAB_00128109;
    pcStack_1f8 = (code *)0x127f9a;
    bson_decimal128_to_string(&uStack_1b8,&cStack_1f0);
    unaff_R14 = CONCAT17(cStack_1e9,
                         CONCAT16(cStack_1ea,
                                  CONCAT15(cStack_1eb,
                                           CONCAT14(cStack_1ec,
                                                    CONCAT13(cStack_1ed,
                                                             CONCAT12(cStack_1ee,
                                                                      CONCAT11(cStack_1ef,cStack_1f0
                                                                              ))))))) ^
                0x363731362d45312d;
    if (cStack_1e8 != '\0' || unaff_R14 != 0) goto LAB_0012810e;
    pcStack_1f8 = (code *)0x127fbd;
    bson_decimal128_to_string(&uStack_138,&cStack_1f0);
    auVar5[0] = -((char)uStack_1e0 == '1');
    auVar5[1] = -((char)((uint)uStack_1e0 >> 8) == '1');
    auVar5[2] = -((char)((uint)uStack_1e0 >> 0x10) == '2');
    auVar5[3] = -((char)((uint)uStack_1e0 >> 0x18) == '\0');
    auVar5[4] = 0xff;
    auVar5[5] = 0xff;
    auVar5[6] = 0xff;
    auVar5[7] = 0xff;
    auVar5[8] = 0xff;
    auVar5[9] = 0xff;
    auVar5[10] = 0xff;
    auVar5[0xb] = 0xff;
    auVar5[0xc] = 0xff;
    auVar5[0xd] = 0xff;
    auVar5[0xe] = 0xff;
    auVar5[0xf] = 0xff;
    auVar4[0] = -(cStack_1f0 == '9');
    auVar4[1] = -(cStack_1ef == '.');
    auVar4[2] = -(cStack_1ee == '9');
    auVar4[3] = -(cStack_1ed == '9');
    auVar4[4] = -(cStack_1ec == '9');
    auVar4[5] = -(cStack_1eb == '9');
    auVar4[6] = -(cStack_1ea == '8');
    auVar4[7] = -(cStack_1e9 == '7');
    auVar4[8] = -(cStack_1e8 == '6');
    auVar4[9] = -(cStack_1e7 == '5');
    auVar4[10] = -(cStack_1e6 == '4');
    auVar4[0xb] = -(cStack_1e5 == '3');
    auVar4[0xc] = -(cStack_1e4 == '2');
    auVar4[0xd] = -(cStack_1e3 == '1');
    auVar4[0xe] = -(cStack_1e2 == 'E');
    auVar4[0xf] = -(cStack_1e1 == '+');
    auVar4 = auVar4 & auVar5;
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00128113;
    pcStack_1f8 = (code *)0x127ffc;
    bson_decimal128_to_string(&uStack_148,&cStack_1f0);
    pcStack_1f8 = (code *)0x128010;
    iVar1 = bcmp("9.999999999999999999999999999999999E+6144",&cStack_1f0,0x2a);
    if (iVar1 != 0) goto LAB_00128118;
    pcStack_1f8 = (code *)0x12802b;
    bson_decimal128_to_string(&uStack_158,&cStack_1f0);
    pcStack_1f8 = (code *)0x12803f;
    iVar1 = bcmp("9.999999999999999999999999999999999E-6143",&cStack_1f0,0x2a);
    if (iVar1 != 0) goto LAB_0012811d;
    pcStack_1f8 = (code *)0x12805a;
    bson_decimal128_to_string(&uStack_168,&cStack_1f0);
    if (cStack_1e8 != '\0' ||
        CONCAT17(cStack_1e9,
                 CONCAT16(cStack_1ea,
                          CONCAT15(cStack_1eb,
                                   CONCAT14(cStack_1ec,
                                            CONCAT13(cStack_1ed,
                                                     CONCAT12(cStack_1ee,
                                                              CONCAT11(cStack_1ef,cStack_1f0)))))))
        != 0x392b453035302e31) goto LAB_00128122;
    pcStack_1f8 = (code *)0x128084;
    bson_decimal128_to_string(&uStack_178,&cStack_1f0);
    if (cStack_1e8 != '\0' ||
        CONCAT17(cStack_1e9,
                 CONCAT16(cStack_1ea,
                          CONCAT15(cStack_1eb,
                                   CONCAT14(cStack_1ec,
                                            CONCAT13(cStack_1ed,
                                                     CONCAT12(cStack_1ee,
                                                              CONCAT11(cStack_1ef,cStack_1f0)))))))
        != 0x342b453035302e31) goto LAB_00128127;
    pcStack_1f8 = (code *)0x1280ae;
    bson_decimal128_to_string(&uStack_188,&cStack_1f0);
    if (CONCAT13(cStack_1ed,CONCAT12(cStack_1ee,CONCAT11(cStack_1ef,cStack_1f0))) != 0x353031)
    goto LAB_0012812c;
    pcStack_1f8 = (code *)0x1280c6;
    bson_decimal128_to_string(&uStack_198,&cStack_1f0);
    if (CONCAT17(cStack_1e9,
                 CONCAT16(cStack_1ea,
                          CONCAT15(cStack_1eb,
                                   CONCAT14(cStack_1ec,
                                            CONCAT13(cStack_1ed,
                                                     CONCAT12(cStack_1ee,
                                                              CONCAT11(cStack_1ef,cStack_1f0)))))))
        != 0x332b4535302e31) goto LAB_00128131;
    pcStack_1f8 = (code *)0x1280e5;
    bson_decimal128_to_string(&uStack_1a8,&cStack_1f0);
    if (cStack_1ec == '\0' &&
        CONCAT13(cStack_1ed,CONCAT12(cStack_1ee,CONCAT11(cStack_1ef,cStack_1f0))) == 0x332b4531) {
      return;
    }
  }
  else {
    pcStack_1f8 = (code *)0x128104;
    test_decimal128_to_string__scientific_cold_1();
LAB_00128104:
    pcStack_1f8 = (code *)0x128109;
    test_decimal128_to_string__scientific_cold_2();
LAB_00128109:
    pcStack_1f8 = (code *)0x12810e;
    test_decimal128_to_string__scientific_cold_3();
LAB_0012810e:
    pcStack_1f8 = (code *)0x128113;
    test_decimal128_to_string__scientific_cold_4();
LAB_00128113:
    pcStack_1f8 = (code *)0x128118;
    test_decimal128_to_string__scientific_cold_5();
LAB_00128118:
    pcStack_1f8 = (code *)0x12811d;
    test_decimal128_to_string__scientific_cold_6();
LAB_0012811d:
    pcStack_1f8 = (code *)0x128122;
    test_decimal128_to_string__scientific_cold_7();
LAB_00128122:
    pcStack_1f8 = (code *)0x128127;
    test_decimal128_to_string__scientific_cold_8();
LAB_00128127:
    pcStack_1f8 = (code *)0x12812c;
    test_decimal128_to_string__scientific_cold_9();
LAB_0012812c:
    pcStack_1f8 = (code *)0x128131;
    test_decimal128_to_string__scientific_cold_10();
LAB_00128131:
    pcStack_1f8 = (code *)0x128136;
    test_decimal128_to_string__scientific_cold_11();
  }
  pcStack_1f8 = test_decimal128_to_string__zeros;
  test_decimal128_to_string__scientific_cold_12();
  uStack_200 = 0x3040000000000000;
  uStack_208 = 0;
  uStack_240 = 0x3298000000000000;
  uStack_248 = 0;
  uStack_250 = 0x2b90000000000000;
  uStack_258 = 0;
  pcStack_260 = (code *)0x12818c;
  pcStack_1f8 = (code *)&cStack_1f0;
  bson_decimal128_to_string(&uStack_208,&sStack_238);
  if (sStack_238 == 0x30) {
    pcStack_260 = (code *)0x1281a4;
    bson_decimal128_to_string(&uStack_248,&sStack_238);
    if (iStack_235 != 0x303033 ||
        CONCAT13((undefined1)iStack_235,CONCAT12(uStack_236,sStack_238)) != 0x332b4530)
    goto LAB_001281e5;
    pcStack_260 = (code *)0x1281c7;
    bson_decimal128_to_string(&uStack_258,&sStack_238);
    if (iStack_235 == 0x303036 &&
        CONCAT13((undefined1)iStack_235,CONCAT12(uStack_236,sStack_238)) == 0x362d4530) {
      return;
    }
  }
  else {
    pcStack_260 = (code *)0x1281e5;
    test_decimal128_to_string__zeros_cold_1();
LAB_001281e5:
    pcStack_260 = (code *)0x1281ea;
    test_decimal128_to_string__zeros_cold_2();
  }
  pcStack_260 = test_decimal128_from_string__invalid_inputs;
  test_decimal128_to_string__zeros_cold_3();
  pcStack_288 = (code *)0x128214;
  psStack_268 = &sStack_238;
  pcStack_260 = (code *)unaff_R14;
  bson_decimal128_from_string(".",auStack_278);
  if (lStack_270 == 0x7c00000000000000) {
    pcStack_288 = (code *)0x128232;
    bson_decimal128_from_string(".e",auStack_278);
    if (lStack_270 != 0x7c00000000000000) goto LAB_001283a5;
    pcStack_288 = (code *)0x128250;
    bson_decimal128_from_string("",auStack_278);
    if (lStack_270 != 0x7c00000000000000) goto LAB_001283aa;
    pcStack_288 = (code *)0x12826e;
    bson_decimal128_from_string("invalid",auStack_278);
    if (lStack_270 != 0x7c00000000000000) goto LAB_001283af;
    pcStack_288 = (code *)0x12828c;
    bson_decimal128_from_string("in",auStack_278);
    if (lStack_270 != 0x7c00000000000000) goto LAB_001283b4;
    pcStack_288 = (code *)0x1282aa;
    bson_decimal128_from_string("i",auStack_278);
    if (lStack_270 != 0x7c00000000000000) goto LAB_001283b9;
    pcStack_288 = (code *)0x1282c8;
    bson_decimal128_from_string("E02",auStack_278);
    if (lStack_270 != 0x7c00000000000000) goto LAB_001283be;
    pcStack_288 = (code *)0x1282e6;
    bson_decimal128_from_string("..1",auStack_278);
    if (lStack_270 != 0x7c00000000000000) goto LAB_001283c3;
    pcStack_288 = (code *)0x128304;
    bson_decimal128_from_string("1abcede",auStack_278);
    if (lStack_270 != 0x7c00000000000000) goto LAB_001283c8;
    pcStack_288 = (code *)0x128322;
    bson_decimal128_from_string("1.24abc",auStack_278);
    if (lStack_270 != 0x7c00000000000000) goto LAB_001283cd;
    pcStack_288 = (code *)0x128340;
    bson_decimal128_from_string("1.24abcE+02",auStack_278);
    if (lStack_270 != 0x7c00000000000000) goto LAB_001283d2;
    pcStack_288 = (code *)0x12835e;
    bson_decimal128_from_string("1.24E+02abc2d",auStack_278);
    if (lStack_270 != 0x7c00000000000000) goto LAB_001283d7;
    pcStack_288 = (code *)0x128378;
    bson_decimal128_from_string("E+02",auStack_278);
    if (lStack_270 != 0x7c00000000000000) goto LAB_001283dc;
    pcStack_288 = (code *)0x128392;
    bson_decimal128_from_string("e+02",auStack_278);
    if (lStack_270 == 0x7c00000000000000) {
      return;
    }
  }
  else {
    pcStack_288 = (code *)0x1283a5;
    test_decimal128_from_string__invalid_inputs_cold_1();
LAB_001283a5:
    pcStack_288 = (code *)0x1283aa;
    test_decimal128_from_string__invalid_inputs_cold_2();
LAB_001283aa:
    pcStack_288 = (code *)0x1283af;
    test_decimal128_from_string__invalid_inputs_cold_3();
LAB_001283af:
    pcStack_288 = (code *)0x1283b4;
    test_decimal128_from_string__invalid_inputs_cold_4();
LAB_001283b4:
    pcStack_288 = (code *)0x1283b9;
    test_decimal128_from_string__invalid_inputs_cold_5();
LAB_001283b9:
    pcStack_288 = (code *)0x1283be;
    test_decimal128_from_string__invalid_inputs_cold_6();
LAB_001283be:
    pcStack_288 = (code *)0x1283c3;
    test_decimal128_from_string__invalid_inputs_cold_7();
LAB_001283c3:
    pcStack_288 = (code *)0x1283c8;
    test_decimal128_from_string__invalid_inputs_cold_8();
LAB_001283c8:
    pcStack_288 = (code *)0x1283cd;
    test_decimal128_from_string__invalid_inputs_cold_9();
LAB_001283cd:
    pcStack_288 = (code *)0x1283d2;
    test_decimal128_from_string__invalid_inputs_cold_10();
LAB_001283d2:
    pcStack_288 = (code *)0x1283d7;
    test_decimal128_from_string__invalid_inputs_cold_11();
LAB_001283d7:
    pcStack_288 = (code *)0x1283dc;
    test_decimal128_from_string__invalid_inputs_cold_12();
LAB_001283dc:
    pcStack_288 = (code *)0x1283e1;
    test_decimal128_from_string__invalid_inputs_cold_13();
  }
  pcStack_288 = test_decimal128_from_string__nan;
  test_decimal128_from_string__invalid_inputs_cold_14();
  pcStack_288 = (code *)0x7c00000000000000;
  pcStack_2b0 = (code *)0x12840b;
  puStack_290 = auStack_278;
  bson_decimal128_from_string("NaN",auStack_2a0);
  if (lStack_298 == 0x7c00000000000000) {
    pcStack_2b0 = (code *)0x128429;
    bson_decimal128_from_string("+NaN",auStack_2a0);
    if (lStack_298 != 0x7c00000000000000) goto LAB_00128520;
    pcStack_2b0 = (code *)0x128447;
    bson_decimal128_from_string("-NaN",auStack_2a0);
    if (lStack_298 != 0x7c00000000000000) goto LAB_00128525;
    pcStack_2b0 = (code *)0x128465;
    bson_decimal128_from_string("-nan",auStack_2a0);
    if (lStack_298 != 0x7c00000000000000) goto LAB_0012852a;
    pcStack_2b0 = (code *)0x128483;
    bson_decimal128_from_string("1e",auStack_2a0);
    if (lStack_298 != 0x7c00000000000000) goto LAB_0012852f;
    pcStack_2b0 = (code *)0x1284a1;
    bson_decimal128_from_string("+nan",auStack_2a0);
    if (lStack_298 != 0x7c00000000000000) goto LAB_00128534;
    pcStack_2b0 = (code *)0x1284bf;
    bson_decimal128_from_string("nan",auStack_2a0);
    if (lStack_298 != 0x7c00000000000000) goto LAB_00128539;
    pcStack_2b0 = (code *)0x1284d9;
    bson_decimal128_from_string("Nan",auStack_2a0);
    if (lStack_298 != 0x7c00000000000000) goto LAB_0012853e;
    pcStack_2b0 = (code *)0x1284f3;
    bson_decimal128_from_string("+Nan",auStack_2a0);
    if (lStack_298 != 0x7c00000000000000) goto LAB_00128543;
    pcStack_2b0 = (code *)0x12850d;
    bson_decimal128_from_string("-Nan",auStack_2a0);
    if (lStack_298 == 0x7c00000000000000) {
      return;
    }
  }
  else {
    pcStack_2b0 = (code *)0x128520;
    test_decimal128_from_string__nan_cold_1();
LAB_00128520:
    pcStack_2b0 = (code *)0x128525;
    test_decimal128_from_string__nan_cold_2();
LAB_00128525:
    pcStack_2b0 = (code *)0x12852a;
    test_decimal128_from_string__nan_cold_3();
LAB_0012852a:
    pcStack_2b0 = (code *)0x12852f;
    test_decimal128_from_string__nan_cold_4();
LAB_0012852f:
    pcStack_2b0 = (code *)0x128534;
    test_decimal128_from_string__nan_cold_5();
LAB_00128534:
    pcStack_2b0 = (code *)0x128539;
    test_decimal128_from_string__nan_cold_6();
LAB_00128539:
    pcStack_2b0 = (code *)0x12853e;
    test_decimal128_from_string__nan_cold_7();
LAB_0012853e:
    pcStack_2b0 = (code *)0x128543;
    test_decimal128_from_string__nan_cold_8();
LAB_00128543:
    pcStack_2b0 = (code *)0x128548;
    test_decimal128_from_string__nan_cold_9();
  }
  pcStack_2b0 = test_decimal128_from_string__infinity;
  test_decimal128_from_string__nan_cold_10();
  pcStack_2b0 = (code *)0x7c00000000000000;
  uVar3 = 0x7800000000000000;
  pcStack_2d8 = (code *)0x128572;
  puStack_2b8 = auStack_2a0;
  bson_decimal128_from_string("Infinity",auStack_2c8);
  if (lStack_2c0 == 0x7800000000000000) {
    pcStack_2d8 = (code *)0x12858c;
    bson_decimal128_from_string("+Infinity",auStack_2c8);
    if (lStack_2c0 != 0x7800000000000000) goto LAB_001285f7;
    pcStack_2d8 = (code *)0x1285a6;
    bson_decimal128_from_string("+Inf",auStack_2c8);
    if (lStack_2c0 != 0x7800000000000000) goto LAB_001285fc;
    uVar3 = 0xf800000000000000;
    pcStack_2d8 = (code *)0x1285ca;
    bson_decimal128_from_string("-Inf",auStack_2c8);
    if (lStack_2c0 != -0x800000000000000) goto LAB_00128601;
    pcStack_2d8 = (code *)0x1285e4;
    bson_decimal128_from_string("-Infinity",auStack_2c8);
    if (lStack_2c0 == -0x800000000000000) {
      return;
    }
  }
  else {
    pcStack_2d8 = (code *)0x1285f7;
    test_decimal128_from_string__infinity_cold_1();
LAB_001285f7:
    pcStack_2d8 = (code *)0x1285fc;
    test_decimal128_from_string__infinity_cold_2();
LAB_001285fc:
    pcStack_2d8 = (code *)0x128601;
    test_decimal128_from_string__infinity_cold_3();
LAB_00128601:
    pcStack_2d8 = (code *)0x128606;
    test_decimal128_from_string__infinity_cold_4();
  }
  pcStack_2d8 = test_decimal128_from_string__simple;
  test_decimal128_from_string__infinity_cold_5();
  pcStack_3a0 = (code *)0x128636;
  puStack_2e0 = auStack_2c8;
  pcStack_2d8 = (code *)uVar3;
  bson_decimal128_from_string("1",&cStack_2f0);
  pcStack_3a0 = (code *)0x12864a;
  bson_decimal128_from_string("-1",&cStack_300);
  pcStack_3a0 = (code *)0x12865e;
  bson_decimal128_from_string("0",&cStack_310);
  pcStack_3a0 = (code *)0x12866f;
  bson_decimal128_from_string("-0",&cStack_320);
  pcStack_3a0 = (code *)0x128680;
  bson_decimal128_from_string("12345678901234567",&cStack_330);
  pcStack_3a0 = (code *)0x128691;
  bson_decimal128_from_string("989898983458",&cStack_340);
  pcStack_3a0 = (code *)0x1286a2;
  bson_decimal128_from_string("-12345678901234567",&cStack_350);
  pcStack_3a0 = (code *)0x1286b3;
  bson_decimal128_from_string("0.12345",&cStack_360);
  pcStack_3a0 = (code *)0x1286c4;
  bson_decimal128_from_string("0.0012345",&cStack_370);
  pcStack_3a0 = (code *)0x1286d5;
  bson_decimal128_from_string("00012345678901234567",&cStack_380);
  uStack_388 = 0x3040000000000000;
  uStack_390 = 1;
  auVar6[0] = -(cStack_2f0 == '\x01');
  auVar6[1] = -(cStack_2ef == '\0');
  auVar6[2] = -(cStack_2ee == '\0');
  auVar6[3] = -(cStack_2ed == '\0');
  auVar6[4] = -(cStack_2ec == '\0');
  auVar6[5] = -(cStack_2eb == '\0');
  auVar6[6] = -(cStack_2ea == '\0');
  auVar6[7] = -(cStack_2e9 == '\0');
  auVar6[8] = -(cStack_2e8 == '\0');
  auVar6[9] = -(cStack_2e7 == '\0');
  auVar6[10] = -(cStack_2e6 == '\0');
  auVar6[0xb] = -(cStack_2e5 == '\0');
  auVar6[0xc] = -(cStack_2e4 == '\0');
  auVar6[0xd] = -(cStack_2e3 == '\0');
  auVar6[0xe] = -(cStack_2e2 == '@');
  auVar6[0xf] = -(cStack_2e1 == '0');
  if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf) ==
      0xffff) {
    uStack_388 = 0xb040000000000000;
    uStack_390 = 1;
    auVar7[0] = -(cStack_300 == '\x01');
    auVar7[1] = -(cStack_2ff == '\0');
    auVar7[2] = -(cStack_2fe == '\0');
    auVar7[3] = -(cStack_2fd == '\0');
    auVar7[4] = -(cStack_2fc == '\0');
    auVar7[5] = -(cStack_2fb == '\0');
    auVar7[6] = -(cStack_2fa == '\0');
    auVar7[7] = -(cStack_2f9 == '\0');
    auVar7[8] = -(cStack_2f8 == '\0');
    auVar7[9] = -(cStack_2f7 == '\0');
    auVar7[10] = -(cStack_2f6 == '\0');
    auVar7[0xb] = -(cStack_2f5 == '\0');
    auVar7[0xc] = -(cStack_2f4 == '\0');
    auVar7[0xd] = -(cStack_2f3 == '\0');
    auVar7[0xe] = -(cStack_2f2 == '@');
    auVar7[0xf] = -(cStack_2f1 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_001288ca;
    uStack_388 = 0x3040000000000000;
    uStack_390 = 0;
    auVar8[0] = -(cStack_310 == '\0');
    auVar8[1] = -(cStack_30f == '\0');
    auVar8[2] = -(cStack_30e == '\0');
    auVar8[3] = -(cStack_30d == '\0');
    auVar8[4] = -(cStack_30c == '\0');
    auVar8[5] = -(cStack_30b == '\0');
    auVar8[6] = -(cStack_30a == '\0');
    auVar8[7] = -(cStack_309 == '\0');
    auVar8[8] = -(cStack_308 == '\0');
    auVar8[9] = -(cStack_307 == '\0');
    auVar8[10] = -(cStack_306 == '\0');
    auVar8[0xb] = -(cStack_305 == '\0');
    auVar8[0xc] = -(cStack_304 == '\0');
    auVar8[0xd] = -(cStack_303 == '\0');
    auVar8[0xe] = -(cStack_302 == '@');
    auVar8[0xf] = -(cStack_301 == '0');
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_001288cf;
    uStack_388 = 0xb040000000000000;
    uStack_390 = 0;
    auVar9[0] = -(cStack_320 == '\0');
    auVar9[1] = -(cStack_31f == '\0');
    auVar9[2] = -(cStack_31e == '\0');
    auVar9[3] = -(cStack_31d == '\0');
    auVar9[4] = -(cStack_31c == '\0');
    auVar9[5] = -(cStack_31b == '\0');
    auVar9[6] = -(cStack_31a == '\0');
    auVar9[7] = -(cStack_319 == '\0');
    auVar9[8] = -(cStack_318 == '\0');
    auVar9[9] = -(cStack_317 == '\0');
    auVar9[10] = -(cStack_316 == '\0');
    auVar9[0xb] = -(cStack_315 == '\0');
    auVar9[0xc] = -(cStack_314 == '\0');
    auVar9[0xd] = -(cStack_313 == '\0');
    auVar9[0xe] = -(cStack_312 == '@');
    auVar9[0xf] = -(cStack_311 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_001288d4;
    uStack_388 = 0x3040000000000000;
    uStack_390 = 0x2bdc545d6b4b87;
    auVar10[0] = -(cStack_330 == -0x79);
    auVar10[1] = -(cStack_32f == 'K');
    auVar10[2] = -(cStack_32e == 'k');
    auVar10[3] = -(cStack_32d == ']');
    auVar10[4] = -(cStack_32c == 'T');
    auVar10[5] = -(cStack_32b == -0x24);
    auVar10[6] = -(cStack_32a == '+');
    auVar10[7] = -(cStack_329 == '\0');
    auVar10[8] = -(cStack_328 == '\0');
    auVar10[9] = -(cStack_327 == '\0');
    auVar10[10] = -(cStack_326 == '\0');
    auVar10[0xb] = -(cStack_325 == '\0');
    auVar10[0xc] = -(cStack_324 == '\0');
    auVar10[0xd] = -(cStack_323 == '\0');
    auVar10[0xe] = -(cStack_322 == '@');
    auVar10[0xf] = -(cStack_321 == '0');
    if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_001288d9;
    uStack_388 = 0x3040000000000000;
    uStack_390 = 0xe67a93c822;
    auVar11[0] = -(cStack_340 == '\"');
    auVar11[1] = -(cStack_33f == -0x38);
    auVar11[2] = -(cStack_33e == -0x6d);
    auVar11[3] = -(cStack_33d == 'z');
    auVar11[4] = -(cStack_33c == -0x1a);
    auVar11[5] = -(cStack_33b == '\0');
    auVar11[6] = -(cStack_33a == '\0');
    auVar11[7] = -(cStack_339 == '\0');
    auVar11[8] = -(cStack_338 == '\0');
    auVar11[9] = -(cStack_337 == '\0');
    auVar11[10] = -(cStack_336 == '\0');
    auVar11[0xb] = -(cStack_335 == '\0');
    auVar11[0xc] = -(cStack_334 == '\0');
    auVar11[0xd] = -(cStack_333 == '\0');
    auVar11[0xe] = -(cStack_332 == '@');
    auVar11[0xf] = -(cStack_331 == '0');
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_001288de;
    uStack_388 = 0xb040000000000000;
    uStack_390 = 0x2bdc545d6b4b87;
    auVar12[0] = -(cStack_350 == -0x79);
    auVar12[1] = -(cStack_34f == 'K');
    auVar12[2] = -(cStack_34e == 'k');
    auVar12[3] = -(cStack_34d == ']');
    auVar12[4] = -(cStack_34c == 'T');
    auVar12[5] = -(cStack_34b == -0x24);
    auVar12[6] = -(cStack_34a == '+');
    auVar12[7] = -(cStack_349 == '\0');
    auVar12[8] = -(cStack_348 == '\0');
    auVar12[9] = -(cStack_347 == '\0');
    auVar12[10] = -(cStack_346 == '\0');
    auVar12[0xb] = -(cStack_345 == '\0');
    auVar12[0xc] = -(cStack_344 == '\0');
    auVar12[0xd] = -(cStack_343 == '\0');
    auVar12[0xe] = -(cStack_342 == '@');
    auVar12[0xf] = -(cStack_341 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_001288e3;
    uStack_388 = 0x3036000000000000;
    uStack_390 = 0x3039;
    auVar13[0] = -(cStack_360 == '9');
    auVar13[1] = -(cStack_35f == '0');
    auVar13[2] = -(cStack_35e == '\0');
    auVar13[3] = -(cStack_35d == '\0');
    auVar13[4] = -(cStack_35c == '\0');
    auVar13[5] = -(cStack_35b == '\0');
    auVar13[6] = -(cStack_35a == '\0');
    auVar13[7] = -(cStack_359 == '\0');
    auVar13[8] = -(cStack_358 == '\0');
    auVar13[9] = -(cStack_357 == '\0');
    auVar13[10] = -(cStack_356 == '\0');
    auVar13[0xb] = -(cStack_355 == '\0');
    auVar13[0xc] = -(cStack_354 == '\0');
    auVar13[0xd] = -(cStack_353 == '\0');
    auVar13[0xe] = -(cStack_352 == '6');
    auVar13[0xf] = -(cStack_351 == '0');
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_001288e8;
    uStack_388 = 0x3032000000000000;
    uStack_390 = 0x3039;
    auVar14[0] = -(cStack_370 == '9');
    auVar14[1] = -(cStack_36f == '0');
    auVar14[2] = -(cStack_36e == '\0');
    auVar14[3] = -(cStack_36d == '\0');
    auVar14[4] = -(cStack_36c == '\0');
    auVar14[5] = -(cStack_36b == '\0');
    auVar14[6] = -(cStack_36a == '\0');
    auVar14[7] = -(cStack_369 == '\0');
    auVar14[8] = -(cStack_368 == '\0');
    auVar14[9] = -(cStack_367 == '\0');
    auVar14[10] = -(cStack_366 == '\0');
    auVar14[0xb] = -(cStack_365 == '\0');
    auVar14[0xc] = -(cStack_364 == '\0');
    auVar14[0xd] = -(cStack_363 == '\0');
    auVar14[0xe] = -(cStack_362 == '2');
    auVar14[0xf] = -(cStack_361 == '0');
    if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_001288ed;
    uStack_388 = 0x3040000000000000;
    uStack_390 = 0x2bdc545d6b4b87;
    auVar15[0] = -(cStack_380 == -0x79);
    auVar15[1] = -(cStack_37f == 'K');
    auVar15[2] = -(cStack_37e == 'k');
    auVar15[3] = -(cStack_37d == ']');
    auVar15[4] = -(cStack_37c == 'T');
    auVar15[5] = -(cStack_37b == -0x24);
    auVar15[6] = -(cStack_37a == '+');
    auVar15[7] = -(cStack_379 == '\0');
    auVar15[8] = -(cStack_378 == '\0');
    auVar15[9] = -(cStack_377 == '\0');
    auVar15[10] = -(cStack_376 == '\0');
    auVar15[0xb] = -(cStack_375 == '\0');
    auVar15[0xc] = -(cStack_374 == '\0');
    auVar15[0xd] = -(cStack_373 == '\0');
    auVar15[0xe] = -(cStack_372 == '@');
    auVar15[0xf] = -(cStack_371 == '0');
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_3a0 = (code *)0x1288ca;
    test_decimal128_from_string__simple_cold_1();
LAB_001288ca:
    pcStack_3a0 = (code *)0x1288cf;
    test_decimal128_from_string__simple_cold_2();
LAB_001288cf:
    pcStack_3a0 = (code *)0x1288d4;
    test_decimal128_from_string__simple_cold_3();
LAB_001288d4:
    pcStack_3a0 = (code *)0x1288d9;
    test_decimal128_from_string__simple_cold_4();
LAB_001288d9:
    pcStack_3a0 = (code *)0x1288de;
    test_decimal128_from_string__simple_cold_5();
LAB_001288de:
    pcStack_3a0 = (code *)0x1288e3;
    test_decimal128_from_string__simple_cold_6();
LAB_001288e3:
    pcStack_3a0 = (code *)0x1288e8;
    test_decimal128_from_string__simple_cold_7();
LAB_001288e8:
    pcStack_3a0 = (code *)0x1288ed;
    test_decimal128_from_string__simple_cold_8();
LAB_001288ed:
    pcStack_3a0 = (code *)0x1288f2;
    test_decimal128_from_string__simple_cold_9();
  }
  pcStack_3a0 = test_decimal128_from_string__scientific;
  test_decimal128_from_string__simple_cold_10();
  pcVar2 = &cStack_3b0;
  pcStack_428 = (code *)0x128913;
  pcStack_3a0 = (code *)&cStack_2f0;
  bson_decimal128_from_string("10e0",pcVar2);
  pcStack_428 = (code *)0x128924;
  bson_decimal128_from_string("1e1",&cStack_3e0);
  pcStack_428 = (code *)0x128935;
  bson_decimal128_from_string("10e-1",auStack_3f0);
  uStack_418 = 0x3040000000000000;
  uStack_420 = 10;
  auVar16[0] = -(cStack_3b0 == '\n');
  auVar16[1] = -(cStack_3af == '\0');
  auVar16[2] = -(cStack_3ae == '\0');
  auVar16[3] = -(cStack_3ad == '\0');
  auVar16[4] = -(cStack_3ac == '\0');
  auVar16[5] = -(cStack_3ab == '\0');
  auVar16[6] = -(cStack_3aa == '\0');
  auVar16[7] = -(cStack_3a9 == '\0');
  auVar16[8] = -(cStack_3a8 == '\0');
  auVar16[9] = -(cStack_3a7 == '\0');
  auVar16[10] = -(cStack_3a6 == '\0');
  auVar16[0xb] = -(cStack_3a5 == '\0');
  auVar16[0xc] = -(cStack_3a4 == '\0');
  auVar16[0xd] = -(cStack_3a3 == '\0');
  auVar16[0xe] = -(cStack_3a2 == '@');
  auVar16[0xf] = -(cStack_3a1 == '0');
  if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | (ushort)(auVar16[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_418 = 0x3042000000000000;
    uStack_420 = 1;
    auVar17[0] = -(cStack_3e0 == '\x01');
    auVar17[1] = -(cStack_3df == '\0');
    auVar17[2] = -(cStack_3de == '\0');
    auVar17[3] = -(cStack_3dd == '\0');
    auVar17[4] = -(cStack_3dc == '\0');
    auVar17[5] = -(cStack_3db == '\0');
    auVar17[6] = -(cStack_3da == '\0');
    auVar17[7] = -(cStack_3d9 == '\0');
    auVar17[8] = -(cStack_3d8 == '\0');
    auVar17[9] = -(cStack_3d7 == '\0');
    auVar17[10] = -(cStack_3d6 == '\0');
    auVar17[0xb] = -(cStack_3d5 == '\0');
    auVar17[0xc] = -(cStack_3d4 == '\0');
    auVar17[0xd] = -(cStack_3d3 == '\0');
    auVar17[0xe] = -(cStack_3d2 == 'B');
    auVar17[0xf] = -(cStack_3d1 == '0');
    if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128af2;
    uStack_418 = 0x303e000000000000;
    uStack_420 = 10;
    auVar18[0] = -(auStack_3f0[0] == '\n');
    auVar18[1] = -(auStack_3f0[1] == '\0');
    auVar18[2] = -(auStack_3f0[2] == '\0');
    auVar18[3] = -(auStack_3f0[3] == '\0');
    auVar18[4] = -(auStack_3f0[4] == '\0');
    auVar18[5] = -(auStack_3f0[5] == '\0');
    auVar18[6] = -(auStack_3f0[6] == '\0');
    auVar18[7] = -(auStack_3f0[7] == '\0');
    auVar18[8] = -(auStack_3f0[8] == '\0');
    auVar18[9] = -(auStack_3f0[9] == '\0');
    auVar18[10] = -(auStack_3f0[10] == '\0');
    auVar18[0xb] = -(auStack_3f0[0xb] == '\0');
    auVar18[0xc] = -(auStack_3f0[0xc] == '\0');
    auVar18[0xd] = -(auStack_3f0[0xd] == '\0');
    auVar18[0xe] = -(auStack_3f0[0xe] == '>');
    auVar18[0xf] = -(auStack_3f0[0xf] == '0');
    if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128af7;
    pcVar2 = &cStack_3c0;
    pcStack_428 = (code *)0x1289e6;
    bson_decimal128_from_string("12345678901234567e6111",pcVar2);
    pcStack_428 = (code *)0x1289f7;
    bson_decimal128_from_string("1e-6176",auStack_400);
    uStack_418 = 0x5ffe000000000000;
    uStack_420 = 0x2bdc545d6b4b87;
    auVar19[0] = -(cStack_3c0 == -0x79);
    auVar19[1] = -(cStack_3bf == 'K');
    auVar19[2] = -(cStack_3be == 'k');
    auVar19[3] = -(cStack_3bd == ']');
    auVar19[4] = -(cStack_3bc == 'T');
    auVar19[5] = -(cStack_3bb == -0x24);
    auVar19[6] = -(cStack_3ba == '+');
    auVar19[7] = -(cStack_3b9 == '\0');
    auVar19[8] = -(cStack_3b8 == '\0');
    auVar19[9] = -(cStack_3b7 == '\0');
    auVar19[10] = -(cStack_3b6 == '\0');
    auVar19[0xb] = -(cStack_3b5 == '\0');
    auVar19[0xc] = -(cStack_3b4 == '\0');
    auVar19[0xd] = -(cStack_3b3 == '\0');
    auVar19[0xe] = -(cStack_3b2 == -2);
    auVar19[0xf] = -(cStack_3b1 == '_');
    if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128afc;
    uStack_418 = 0;
    uStack_420 = 1;
    auVar20[0] = -(auStack_400[0] == '\x01');
    auVar20[1] = -(auStack_400[1] == '\0');
    auVar20[2] = -(auStack_400[2] == '\0');
    auVar20[3] = -(auStack_400[3] == '\0');
    auVar20[4] = -(auStack_400[4] == '\0');
    auVar20[5] = -(auStack_400[5] == '\0');
    auVar20[6] = -(auStack_400[6] == '\0');
    auVar20[7] = -(auStack_400[7] == '\0');
    auVar20[8] = -(auStack_400[8] == '\0');
    auVar20[9] = -(auStack_400[9] == '\0');
    auVar20[10] = -(auStack_400[10] == '\0');
    auVar20[0xb] = -(auStack_400[0xb] == '\0');
    auVar20[0xc] = -(auStack_400[0xc] == '\0');
    auVar20[0xd] = -(auStack_400[0xd] == '\0');
    auVar20[0xe] = -(auStack_400[0xe] == '\0');
    auVar20[0xf] = -(auStack_400[0xf] == '\0');
    if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128b01;
    pcVar2 = &cStack_3d0;
    pcStack_428 = (code *)0x128a73;
    bson_decimal128_from_string("-100E-10",pcVar2);
    pcStack_428 = (code *)0x128a84;
    bson_decimal128_from_string("10.50E8",&cStack_410);
    uStack_418 = 0xb02c000000000000;
    uStack_420 = 100;
    auVar21[0] = -(cStack_3d0 == 'd');
    auVar21[1] = -(cStack_3cf == '\0');
    auVar21[2] = -(cStack_3ce == '\0');
    auVar21[3] = -(cStack_3cd == '\0');
    auVar21[4] = -(cStack_3cc == '\0');
    auVar21[5] = -(cStack_3cb == '\0');
    auVar21[6] = -(cStack_3ca == '\0');
    auVar21[7] = -(cStack_3c9 == '\0');
    auVar21[8] = -(cStack_3c8 == '\0');
    auVar21[9] = -(cStack_3c7 == '\0');
    auVar21[10] = -(cStack_3c6 == '\0');
    auVar21[0xb] = -(cStack_3c5 == '\0');
    auVar21[0xc] = -(cStack_3c4 == '\0');
    auVar21[0xd] = -(cStack_3c3 == '\0');
    auVar21[0xe] = -(cStack_3c2 == ',');
    auVar21[0xf] = -(cStack_3c1 == -0x50);
    if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128b06;
    uStack_418 = 0x304c000000000000;
    uStack_420 = 0x41a;
    auVar22[0] = -(cStack_410 == '\x1a');
    auVar22[1] = -(cStack_40f == '\x04');
    auVar22[2] = -(cStack_40e == '\0');
    auVar22[3] = -(cStack_40d == '\0');
    auVar22[4] = -(cStack_40c == '\0');
    auVar22[5] = -(cStack_40b == '\0');
    auVar22[6] = -(cStack_40a == '\0');
    auVar22[7] = -(cStack_409 == '\0');
    auVar22[8] = -(cStack_408 == '\0');
    auVar22[9] = -(cStack_407 == '\0');
    auVar22[10] = -(cStack_406 == '\0');
    auVar22[0xb] = -(cStack_405 == '\0');
    auVar22[0xc] = -(cStack_404 == '\0');
    auVar22[0xd] = -(cStack_403 == '\0');
    auVar22[0xe] = -(cStack_402 == 'L');
    auVar22[0xf] = -(cStack_401 == '0');
    if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe | (ushort)(auVar22[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_428 = (code *)0x128af2;
    test_decimal128_from_string__scientific_cold_1();
LAB_00128af2:
    pcStack_428 = (code *)0x128af7;
    test_decimal128_from_string__scientific_cold_2();
LAB_00128af7:
    pcStack_428 = (code *)0x128afc;
    test_decimal128_from_string__scientific_cold_3();
LAB_00128afc:
    pcStack_428 = (code *)0x128b01;
    test_decimal128_from_string__scientific_cold_4();
LAB_00128b01:
    pcStack_428 = (code *)0x128b06;
    test_decimal128_from_string__scientific_cold_5();
LAB_00128b06:
    pcStack_428 = (code *)0x128b0b;
    test_decimal128_from_string__scientific_cold_6();
  }
  pcStack_428 = test_decimal128_from_string__large;
  test_decimal128_from_string__scientific_cold_7();
  pcStack_490 = (code *)0x128b29;
  pcStack_428 = (code *)pcVar2;
  bson_decimal128_from_string("12345689012345789012345",&cStack_438);
  pcStack_490 = (code *)0x128b3a;
  bson_decimal128_from_string("1234567890123456789012345678901234",&cStack_448);
  pcStack_490 = (code *)0x128b4b;
  bson_decimal128_from_string("9.999999999999999999999999999999999E+6144",&cStack_458);
  pcStack_490 = (code *)0x128b5c;
  bson_decimal128_from_string("9.999999999999999999999999999999999E-6143",&cStack_468);
  pcStack_490 = (code *)0x128b6d;
  bson_decimal128_from_string("5.192296858534827628530496329220095E+33",&cStack_478);
  uStack_480 = 0x304000000000029d;
  uStack_488 = 0x42da3a76f9e0d979;
  auVar23[0] = -(cStack_438 == 'y');
  auVar23[1] = -(cStack_437 == -0x27);
  auVar23[2] = -(cStack_436 == -0x20);
  auVar23[3] = -(cStack_435 == -7);
  auVar23[4] = -(cStack_434 == 'v');
  auVar23[5] = -(cStack_433 == ':');
  auVar23[6] = -(cStack_432 == -0x26);
  auVar23[7] = -(cStack_431 == 'B');
  auVar23[8] = -(cStack_430 == -99);
  auVar23[9] = -(cStack_42f == '\x02');
  auVar23[10] = -(cStack_42e == '\0');
  auVar23[0xb] = -(cStack_42d == '\0');
  auVar23[0xc] = -(cStack_42c == '\0');
  auVar23[0xd] = -(cStack_42b == '\0');
  auVar23[0xe] = -(cStack_42a == '@');
  auVar23[0xf] = -(cStack_429 == '0');
  if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe | (ushort)(auVar23[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_480 = 0x30403cde6fff9732;
    uStack_488 = 0xde825cd07e96aff2;
    auVar24[0] = -(cStack_448 == -0xe);
    auVar24[1] = -(cStack_447 == -0x51);
    auVar24[2] = -(cStack_446 == -0x6a);
    auVar24[3] = -(cStack_445 == '~');
    auVar24[4] = -(cStack_444 == -0x30);
    auVar24[5] = -(cStack_443 == '\\');
    auVar24[6] = -(cStack_442 == -0x7e);
    auVar24[7] = -(cStack_441 == -0x22);
    auVar24[8] = -(cStack_440 == '2');
    auVar24[9] = -(cStack_43f == -0x69);
    auVar24[10] = -(cStack_43e == -1);
    auVar24[0xb] = -(cStack_43d == 'o');
    auVar24[0xc] = -(cStack_43c == -0x22);
    auVar24[0xd] = -(cStack_43b == '<');
    auVar24[0xe] = -(cStack_43a == '@');
    auVar24[0xf] = -(cStack_439 == '0');
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe | (ushort)(auVar24[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128c82;
    uStack_480 = 0x5fffed09bead87c0;
    uStack_488 = 0x378d8e63ffffffff;
    auVar25[0] = -(cStack_458 == -1);
    auVar25[1] = -(cStack_457 == -1);
    auVar25[2] = -(cStack_456 == -1);
    auVar25[3] = -(cStack_455 == -1);
    auVar25[4] = -(cStack_454 == 'c');
    auVar25[5] = -(cStack_453 == -0x72);
    auVar25[6] = -(cStack_452 == -0x73);
    auVar25[7] = -(cStack_451 == '7');
    auVar25[8] = -(cStack_450 == -0x40);
    auVar25[9] = -(cStack_44f == -0x79);
    auVar25[10] = -(cStack_44e == -0x53);
    auVar25[0xb] = -(cStack_44d == -0x42);
    auVar25[0xc] = -(cStack_44c == '\t');
    auVar25[0xd] = -(cStack_44b == -0x13);
    auVar25[0xe] = -(cStack_44a == -1);
    auVar25[0xf] = -(cStack_449 == '_');
    if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe | (ushort)(auVar25[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128c87;
    uStack_480 = 0x1ed09bead87c0;
    uStack_488 = 0x378d8e63ffffffff;
    auVar26[0] = -(cStack_468 == -1);
    auVar26[1] = -(cStack_467 == -1);
    auVar26[2] = -(cStack_466 == -1);
    auVar26[3] = -(cStack_465 == -1);
    auVar26[4] = -(cStack_464 == 'c');
    auVar26[5] = -(cStack_463 == -0x72);
    auVar26[6] = -(cStack_462 == -0x73);
    auVar26[7] = -(cStack_461 == '7');
    auVar26[8] = -(cStack_460 == -0x40);
    auVar26[9] = -(cStack_45f == -0x79);
    auVar26[10] = -(cStack_45e == -0x53);
    auVar26[0xb] = -(cStack_45d == -0x42);
    auVar26[0xc] = -(cStack_45c == '\t');
    auVar26[0xd] = -(cStack_45b == -0x13);
    auVar26[0xe] = -(cStack_45a == '\x01');
    auVar26[0xf] = -(cStack_459 == '\0');
    if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe | (ushort)(auVar26[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128c8c;
    uStack_480 = 0x3040ffffffffffff;
    uStack_488 = 0xffffffffffffffff;
    auVar27[0] = -(cStack_478 == -1);
    auVar27[1] = -(cStack_477 == -1);
    auVar27[2] = -(cStack_476 == -1);
    auVar27[3] = -(cStack_475 == -1);
    auVar27[4] = -(cStack_474 == -1);
    auVar27[5] = -(cStack_473 == -1);
    auVar27[6] = -(cStack_472 == -1);
    auVar27[7] = -(cStack_471 == -1);
    auVar27[8] = -(cStack_470 == -1);
    auVar27[9] = -(cStack_46f == -1);
    auVar27[10] = -(cStack_46e == -1);
    auVar27[0xb] = -(cStack_46d == -1);
    auVar27[0xc] = -(cStack_46c == -1);
    auVar27[0xd] = -(cStack_46b == -1);
    auVar27[0xe] = -(cStack_46a == '@');
    auVar27[0xf] = -(cStack_469 == '0');
    if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe | (ushort)(auVar27[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_490 = (code *)0x128c82;
    test_decimal128_from_string__large_cold_1();
LAB_00128c82:
    pcStack_490 = (code *)0x128c87;
    test_decimal128_from_string__large_cold_2();
LAB_00128c87:
    pcStack_490 = (code *)0x128c8c;
    test_decimal128_from_string__large_cold_3();
LAB_00128c8c:
    pcStack_490 = (code *)0x128c91;
    test_decimal128_from_string__large_cold_4();
  }
  pcStack_490 = test_decimal128_from_string__exponent_normalization;
  test_decimal128_from_string__large_cold_5();
  pcStack_490 = (code *)0x3040000000000000;
  pcStack_4f8 = (code *)0x128cbb;
  pcStack_498 = &cStack_438;
  bson_decimal128_from_string("1000000000000000000000000000000000000000",&cStack_4a8);
  pcStack_4f8 = (code *)0x128ccc;
  bson_decimal128_from_string("10000000000000000000000000000000000",&cStack_4b8);
  pcStack_4f8 = (code *)0x128cdd;
  bson_decimal128_from_string("1000000000000000000000000000000000",&cStack_4c8);
  pcStack_4f8 = (code *)0x128cee;
  bson_decimal128_from_string
            ("1000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,&cStack_4d8);
  uStack_4e0 = 0x304c314dc6448d93;
  uStack_4e8 = 0x38c15b0a00000000;
  auVar28[0] = -(cStack_4a8 == '\0');
  auVar28[1] = -(cStack_4a7 == '\0');
  auVar28[2] = -(cStack_4a6 == '\0');
  auVar28[3] = -(cStack_4a5 == '\0');
  auVar28[4] = -(cStack_4a4 == '\n');
  auVar28[5] = -(cStack_4a3 == '[');
  auVar28[6] = -(cStack_4a2 == -0x3f);
  auVar28[7] = -(cStack_4a1 == '8');
  auVar28[8] = -(cStack_4a0 == -0x6d);
  auVar28[9] = -(cStack_49f == -0x73);
  auVar28[10] = -(cStack_49e == 'D');
  auVar28[0xb] = -(cStack_49d == -0x3a);
  auVar28[0xc] = -(cStack_49c == 'M');
  auVar28[0xd] = -(cStack_49b == '1');
  auVar28[0xe] = -(cStack_49a == 'L');
  auVar28[0xf] = -(cStack_499 == '0');
  if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe | (ushort)(auVar28[0xf] >> 7) << 0xf)
      == 0xffff) {
    uStack_4e0 = 0x3042314dc6448d93;
    uStack_4e8 = 0x38c15b0a00000000;
    auVar29[0] = -(cStack_4b8 == '\0');
    auVar29[1] = -(cStack_4b7 == '\0');
    auVar29[2] = -(cStack_4b6 == '\0');
    auVar29[3] = -(cStack_4b5 == '\0');
    auVar29[4] = -(cStack_4b4 == '\n');
    auVar29[5] = -(cStack_4b3 == '[');
    auVar29[6] = -(cStack_4b2 == -0x3f);
    auVar29[7] = -(cStack_4b1 == '8');
    auVar29[8] = -(cStack_4b0 == -0x6d);
    auVar29[9] = -(cStack_4af == -0x73);
    auVar29[10] = -(cStack_4ae == 'D');
    auVar29[0xb] = -(cStack_4ad == -0x3a);
    auVar29[0xc] = -(cStack_4ac == 'M');
    auVar29[0xd] = -(cStack_4ab == '1');
    auVar29[0xe] = -(cStack_4aa == 'B');
    auVar29[0xf] = -(cStack_4a9 == '0');
    if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe | (ushort)(auVar29[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128db9;
    uStack_4e0 = 0x3040314dc6448d93;
    uStack_4e8 = 0x38c15b0a00000000;
    auVar30[0] = -(cStack_4c8 == '\0');
    auVar30[1] = -(cStack_4c7 == '\0');
    auVar30[2] = -(cStack_4c6 == '\0');
    auVar30[3] = -(cStack_4c5 == '\0');
    auVar30[4] = -(cStack_4c4 == '\n');
    auVar30[5] = -(cStack_4c3 == '[');
    auVar30[6] = -(cStack_4c2 == -0x3f);
    auVar30[7] = -(cStack_4c1 == '8');
    auVar30[8] = -(cStack_4c0 == -0x6d);
    auVar30[9] = -(cStack_4bf == -0x73);
    auVar30[10] = -(cStack_4be == 'D');
    auVar30[0xb] = -(cStack_4bd == -0x3a);
    auVar30[0xc] = -(cStack_4bc == 'M');
    auVar30[0xd] = -(cStack_4bb == '1');
    auVar30[0xe] = -(cStack_4ba == '@');
    auVar30[0xf] = -(cStack_4b9 == '0');
    if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128dbe;
    uStack_4e0 = 0x37cc314dc6448d93;
    uStack_4e8 = 0x38c15b0a00000000;
    auVar31[0] = -(cStack_4d8 == '\0');
    auVar31[1] = -(cStack_4d7 == '\0');
    auVar31[2] = -(cStack_4d6 == '\0');
    auVar31[3] = -(cStack_4d5 == '\0');
    auVar31[4] = -(cStack_4d4 == '\n');
    auVar31[5] = -(cStack_4d3 == '[');
    auVar31[6] = -(cStack_4d2 == -0x3f);
    auVar31[7] = -(cStack_4d1 == '8');
    auVar31[8] = -(cStack_4d0 == -0x6d);
    auVar31[9] = -(cStack_4cf == -0x73);
    auVar31[10] = -(cStack_4ce == 'D');
    auVar31[0xb] = -(cStack_4cd == -0x3a);
    auVar31[0xc] = -(cStack_4cc == 'M');
    auVar31[0xd] = -(cStack_4cb == '1');
    auVar31[0xe] = -(cStack_4ca == -0x34);
    auVar31[0xf] = -(cStack_4c9 == '7');
    if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf
                ) == 0xffff) {
      return;
    }
  }
  else {
    pcStack_4f8 = (code *)0x128db9;
    test_decimal128_from_string__exponent_normalization_cold_1();
LAB_00128db9:
    pcStack_4f8 = (code *)0x128dbe;
    test_decimal128_from_string__exponent_normalization_cold_2();
LAB_00128dbe:
    pcStack_4f8 = (code *)0x128dc3;
    test_decimal128_from_string__exponent_normalization_cold_3();
  }
  pcStack_4f8 = test_decimal128_from_string__zeros;
  test_decimal128_from_string__exponent_normalization_cold_4();
  pcStack_4f8 = (code *)&cStack_4a8;
  bson_decimal128_from_string("0",&cStack_508);
  bson_decimal128_from_string("0e-611",&cStack_518);
  bson_decimal128_from_string("0e+6000",&cStack_528);
  pcVar2 = "-0e-1";
  bson_decimal128_from_string("-0e-1",&cStack_538);
  auVar32[0] = -(cStack_508 == '\0');
  auVar32[1] = -(cStack_507 == '\0');
  auVar32[2] = -(cStack_506 == '\0');
  auVar32[3] = -(cStack_505 == '\0');
  auVar32[4] = -(cStack_504 == '\0');
  auVar32[5] = -(cStack_503 == '\0');
  auVar32[6] = -(cStack_502 == '\0');
  auVar32[7] = -(cStack_501 == '\0');
  auVar32[8] = -(cStack_500 == '\0');
  auVar32[9] = -(cStack_4ff == '\0');
  auVar32[10] = -(cStack_4fe == '\0');
  auVar32[0xb] = -(cStack_4fd == '\0');
  auVar32[0xc] = -(cStack_4fc == '\0');
  auVar32[0xd] = -(cStack_4fb == '\0');
  auVar32[0xe] = -(cStack_4fa == '@');
  auVar32[0xf] = -(cStack_4f9 == '0');
  if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(auVar32[0xf] >> 7) << 0xf)
      == 0xffff) {
    auVar33[0] = -(cStack_518 == '\0');
    auVar33[1] = -(cStack_517 == '\0');
    auVar33[2] = -(cStack_516 == '\0');
    auVar33[3] = -(cStack_515 == '\0');
    auVar33[4] = -(cStack_514 == '\0');
    auVar33[5] = -(cStack_513 == '\0');
    auVar33[6] = -(cStack_512 == '\0');
    auVar33[7] = -(cStack_511 == '\0');
    auVar33[8] = -(cStack_510 == '\0');
    auVar33[9] = -(cStack_50f == '\0');
    auVar33[10] = -(cStack_50e == '\0');
    auVar33[0xb] = -(cStack_50d == '\0');
    auVar33[0xc] = -(cStack_50c == '\0');
    auVar33[0xd] = -(cStack_50b == '\0');
    auVar33[0xe] = -(cStack_50a == 'z');
    auVar33[0xf] = -(cStack_509 == '+');
    if ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00128ee5;
    auVar34[0] = -(cStack_528 == '\0');
    auVar34[1] = -(cStack_527 == '\0');
    auVar34[2] = -(cStack_526 == '\0');
    auVar34[3] = -(cStack_525 == '\0');
    auVar34[4] = -(cStack_524 == '\0');
    auVar34[5] = -(cStack_523 == '\0');
    auVar34[6] = -(cStack_522 == '\0');
    auVar34[7] = -(cStack_521 == '\0');
    auVar34[8] = -(cStack_520 == '\0');
    auVar34[9] = -(cStack_51f == '\0');
    auVar34[10] = -(cStack_51e == '\0');
    auVar34[0xb] = -(cStack_51d == '\0');
    auVar34[0xc] = -(cStack_51c == '\0');
    auVar34[0xd] = -(cStack_51b == '\0');
    auVar34[0xe] = -(cStack_51a == ' ');
    auVar34[0xf] = -(cStack_519 == '_');
    if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe | (ushort)(auVar34[0xf] >> 7) << 0xf
                ) == 0xffff) {
      auVar35[0] = -(cStack_538 == '\0');
      auVar35[1] = -(cStack_537 == '\0');
      auVar35[2] = -(cStack_536 == '\0');
      auVar35[3] = -(cStack_535 == '\0');
      auVar35[4] = -(cStack_534 == '\0');
      auVar35[5] = -(cStack_533 == '\0');
      auVar35[6] = -(cStack_532 == '\0');
      auVar35[7] = -(cStack_531 == '\0');
      auVar35[8] = -(cStack_530 == '\0');
      auVar35[9] = -(cStack_52f == '\0');
      auVar35[10] = -(cStack_52e == '\0');
      auVar35[0xb] = -(cStack_52d == '\0');
      auVar35[0xc] = -(cStack_52c == '\0');
      auVar35[0xd] = -(cStack_52b == '\0');
      auVar35[0xe] = -(cStack_52a == '>');
      auVar35[0xf] = -(cStack_529 == -0x50);
      if ((ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar35[0xf] >> 7) << 0xf) == 0xffff) {
        return;
      }
      goto LAB_00128eef;
    }
  }
  else {
    test_decimal128_from_string__zeros_cold_1();
LAB_00128ee5:
    test_decimal128_from_string__zeros_cold_2();
  }
  test_decimal128_from_string__zeros_cold_3();
LAB_00128eef:
  test_decimal128_from_string__zeros_cold_4();
  TestSuite_Add((TestSuite *)pcVar2,"/bson/error/basic",test_bson_error_basic);
  return;
}

Assistant:

static void
test_decimal128_to_string__regular (void)
{
   char bid_string[BSON_DECIMAL128_STRING];
   bson_decimal128_t one;
   bson_decimal128_t zero;
   bson_decimal128_t two;
   bson_decimal128_t negative_one;
   bson_decimal128_t negative_zero;
   bson_decimal128_t tenth;
   bson_decimal128_t smallest_regular;
   bson_decimal128_t largest_regular;
   bson_decimal128_t trailing_zeros;
   bson_decimal128_t all_digits;
   bson_decimal128_t full_house;

   DECIMAL128_FROM_ULLS (one, 0x3040000000000000, 0x0000000000000001);
   DECIMAL128_FROM_ULLS (zero, 0x3040000000000000, 0x0000000000000000);
   DECIMAL128_FROM_ULLS (two, 0x3040000000000000, 0x0000000000000002);
   DECIMAL128_FROM_ULLS (negative_one, 0xb040000000000000, 0x0000000000000001);
   DECIMAL128_FROM_ULLS (negative_zero, 0xb040000000000000, 0x0000000000000000);
   DECIMAL128_FROM_ULLS (
      tenth, 0x303e000000000000, 0x0000000000000001); /* 0.1 */
   /* 0.001234 */
   DECIMAL128_FROM_ULLS (
      smallest_regular, 0x3034000000000000, 0x00000000000004d2);
   /* 12345789012 */
   DECIMAL128_FROM_ULLS (
      largest_regular, 0x3040000000000000, 0x0000001cbe991a14);
   /* 0.00123400000 */
   DECIMAL128_FROM_ULLS (
      trailing_zeros, 0x302a000000000000, 0x00000000075aef40);
   /* 0.1234567890123456789012345678901234 */
   DECIMAL128_FROM_ULLS (all_digits, 0x2ffc3cde6fff9732, 0xde825cd07e96aff2);

   /* 5192296858534827628530496329220095 */
   DECIMAL128_FROM_ULLS (full_house, 0x3040ffffffffffff, 0xffffffffffffffff);

   bson_decimal128_to_string (&one, bid_string);
   BSON_ASSERT (!strcmp ("1", bid_string));

   bson_decimal128_to_string (&zero, bid_string);
   BSON_ASSERT (!strcmp ("0", bid_string));

   bson_decimal128_to_string (&two, bid_string);
   BSON_ASSERT (!strcmp ("2", bid_string));

   bson_decimal128_to_string (&negative_one, bid_string);
   BSON_ASSERT (!strcmp ("-1", bid_string));

   bson_decimal128_to_string (&negative_zero, bid_string);
   BSON_ASSERT (!strcmp ("-0", bid_string));

   bson_decimal128_to_string (&tenth, bid_string);
   BSON_ASSERT (!strcmp ("0.1", bid_string));

   bson_decimal128_to_string (&smallest_regular, bid_string);
   BSON_ASSERT (!strcmp ("0.001234", bid_string));

   bson_decimal128_to_string (&largest_regular, bid_string);
   BSON_ASSERT (!strcmp ("123456789012", bid_string));

   bson_decimal128_to_string (&trailing_zeros, bid_string);
   BSON_ASSERT (!strcmp ("0.00123400000", bid_string));

   bson_decimal128_to_string (&all_digits, bid_string);
   BSON_ASSERT (!strcmp ("0.1234567890123456789012345678901234", bid_string));

   bson_decimal128_to_string (&full_house, bid_string);
   BSON_ASSERT (!strcmp ("5192296858534827628530496329220095", bid_string));
}